

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::IRContext::KillInstructionIf
          (IRContext *this,inst_iterator *begin,inst_iterator *end,
          function<bool_(spvtools::opt::Instruction_*)> *condition)

{
  Instruction *pIVar1;
  bool bVar2;
  bool bVar3;
  Instruction *inst;
  Instruction *local_38;
  
  inst = (begin->super_iterator).node_;
  if (inst == (end->super_iterator).node_) {
    bVar2 = false;
  }
  else {
    bVar3 = false;
    do {
      while( true ) {
        local_38 = inst;
        if ((condition->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar2 = (*condition->_M_invoker)((_Any_data *)condition,&local_38);
        pIVar1 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if (bVar2) break;
        inst = pIVar1;
        if (pIVar1 == (end->super_iterator).node_) {
          return bVar3;
        }
      }
      KillInst(this,inst);
      bVar3 = true;
      bVar2 = true;
      inst = pIVar1;
    } while (pIVar1 != (end->super_iterator).node_);
  }
  return bVar2;
}

Assistant:

bool IRContext::KillInstructionIf(Module::inst_iterator begin,
                                  Module::inst_iterator end,
                                  std::function<bool(Instruction*)> condition) {
  bool removed = false;
  for (auto it = begin; it != end;) {
    if (!condition(&*it)) {
      ++it;
      continue;
    }

    removed = true;
    // `it` is an iterator on an intrusive list. Next is invalidated on the
    // current node when an instruction is killed. The iterator must be moved
    // forward before deleting the node.
    auto instruction = &*it;
    ++it;
    KillInst(instruction);
  }

  return removed;
}